

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearResampler.cpp
# Opt level: O3

void __thiscall
SRCTools::LinearResampler::process
          (LinearResampler *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  double dVar4;
  FloatSample *pFVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  
  if ((*inLength != 0) && (*outLength != 0)) {
    dVar4 = this->inputToOutputRatio;
    dVar9 = this->position;
    do {
      while (1.0 <= dVar9) {
        dVar9 = dVar9 + -1.0;
        this->position = dVar9;
        *inLength = *inLength - 1;
        uVar3 = *inLength;
        pFVar5 = *inSamples;
        this->lastInputSamples[0] = *pFVar5;
        this->lastInputSamples[1] = pFVar5[1];
        *inSamples = pFVar5 + 2;
        if (uVar3 == 0) {
          return;
        }
      }
      lVar8 = 0;
      pFVar5 = *outSamples;
      bVar6 = true;
      do {
        bVar7 = bVar6;
        fVar1 = this->lastInputSamples[lVar8];
        fVar2 = (*inSamples)[lVar8];
        *outSamples = pFVar5 + 1;
        *pFVar5 = (float)((double)(fVar2 - fVar1) * dVar9 + (double)fVar1);
        lVar8 = 1;
        pFVar5 = pFVar5 + 1;
        bVar6 = false;
      } while (bVar7);
      *outLength = *outLength - 1;
      uVar3 = *outLength;
      dVar9 = dVar9 + dVar4;
      this->position = dVar9;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void LinearResampler::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	if (inLength == 0) return;
	while (outLength > 0) {
		while (1.0 <= position) {
			position--;
			inLength--;
			for (unsigned int chIx = 0; chIx < LINEAR_RESAMPER_CHANNEL_COUNT; ++chIx) {
				lastInputSamples[chIx] = *(inSamples++);
			}
			if (inLength == 0) return;
		}
		for (unsigned int chIx = 0; chIx < LINEAR_RESAMPER_CHANNEL_COUNT; chIx++) {
			*(outSamples++) = FloatSample(lastInputSamples[chIx] + position * (inSamples[chIx] - lastInputSamples[chIx]));
		}
		outLength--;
		position += inputToOutputRatio;
	}
}